

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readJournalHdr(Pager *pPager,int isHot,i64 journalSize,u32 *pNRec,u32 *pDbSize)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  u32 iPageSize;
  u32 iSectorSize;
  uchar aMagic [8];
  uint local_38;
  uint local_34;
  long local_30;
  
  if (pPager->journalOff == 0) {
    uVar3 = (ulong)pPager->sectorSize;
    lVar4 = 0;
  }
  else {
    uVar3 = (ulong)pPager->sectorSize;
    lVar4 = ((pPager->journalOff + -1) / (long)uVar3 + 1) * uVar3;
  }
  pPager->journalOff = lVar4;
  if (journalSize < (long)(uVar3 + lVar4)) {
    return 0x65;
  }
  if ((isHot != 0) || (lVar4 != pPager->journalHdr)) {
    iVar1 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,8,lVar4);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_30 != -0x289c5edf06fa2a27) {
      return 0x65;
    }
  }
  iVar1 = read32bits(pPager->jfd,lVar4 + 8,pNRec);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = read32bits(pPager->jfd,lVar4 + 0xc,&pPager->cksumInit);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = read32bits(pPager->jfd,lVar4 + 0x10,pDbSize);
  if (iVar1 != 0) {
    return iVar1;
  }
  lVar2 = pPager->journalOff;
  if (lVar2 == 0) {
    iVar1 = read32bits(pPager->jfd,lVar4 + 0x14,&local_34);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = read32bits(pPager->jfd,lVar4 + 0x18,&local_38);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_38 == 0) {
      local_38 = pPager->pageSize;
    }
    if (local_34 - 0x10001 < 0xffff001f || local_38 - 0x10001 < 0xffff01ff) {
      return 0x65;
    }
    if ((local_38 + 0x1ffff & local_38) != 0) {
      return 0x65;
    }
    if ((local_34 + 0x1ffff & local_34) != 0) {
      return 0x65;
    }
    iVar1 = sqlite3PagerSetPagesize(pPager,&local_38,-1);
    pPager->sectorSize = local_34;
    lVar2 = pPager->journalOff;
  }
  else {
    local_34 = pPager->sectorSize;
    iVar1 = 0;
  }
  pPager->journalOff = (ulong)local_34 + lVar2;
  return iVar1;
}

Assistant:

static int readJournalHdr(
  Pager *pPager,               /* Pager object */
  int isHot,
  i64 journalSize,             /* Size of the open journal file in bytes */
  u32 *pNRec,                  /* OUT: Value read from the nRec field */
  u32 *pDbSize                 /* OUT: Value of original database size field */
){
  int rc;                      /* Return code */
  unsigned char aMagic[8];     /* A buffer to hold the magic header */
  i64 iHdrOff;                 /* Offset of journal header being read */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  /* Advance Pager.journalOff to the start of the next sector. If the
  ** journal file is too small for there to be a header stored at this
  ** point, return SQLITE_DONE.
  */
  pPager->journalOff = journalHdrOffset(pPager);
  if( pPager->journalOff+JOURNAL_HDR_SZ(pPager) > journalSize ){
    return SQLITE_DONE;
  }
  iHdrOff = pPager->journalOff;

  /* Read in the first 8 bytes of the journal header. If they do not match
  ** the  magic string found at the start of each journal header, return
  ** SQLITE_DONE. If an IO error occurs, return an error code. Otherwise,
  ** proceed.
  */
  if( isHot || iHdrOff!=pPager->journalHdr ){
    rc = sqlite3OsRead(pPager->jfd, aMagic, sizeof(aMagic), iHdrOff);
    if( rc ){
      return rc;
    }
    if( memcmp(aMagic, aJournalMagic, sizeof(aMagic))!=0 ){
      return SQLITE_DONE;
    }
  }

  /* Read the first three 32-bit fields of the journal header: The nRec
  ** field, the checksum-initializer and the database size at the start
  ** of the transaction. Return an error code if anything goes wrong.
  */
  if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+8, pNRec))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+12, &pPager->cksumInit))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+16, pDbSize))
  ){
    return rc;
  }

  if( pPager->journalOff==0 ){
    u32 iPageSize;               /* Page-size field of journal header */
    u32 iSectorSize;             /* Sector-size field of journal header */

    /* Read the page-size and sector-size journal header fields. */
    if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+20, &iSectorSize))
     || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+24, &iPageSize))
    ){
      return rc;
    }

    /* Versions of SQLite prior to 3.5.8 set the page-size field of the
    ** journal header to zero. In this case, assume that the Pager.pageSize
    ** variable is already set to the correct page size.
    */
    if( iPageSize==0 ){
      iPageSize = pPager->pageSize;
    }

    /* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( iPageSize<512                  || iSectorSize<32
     || iPageSize>SQLITE_MAX_PAGE_SIZE || iSectorSize>MAX_SECTOR_SIZE
     || ((iPageSize-1)&iPageSize)!=0   || ((iSectorSize-1)&iSectorSize)!=0 
    ){
      /* If the either the page-size or sector-size in the journal-header is 
      ** invalid, then the process that wrote the journal-header must have 
      ** crashed before the header was synced. In this case stop reading 
      ** the journal file here.
      */
      return SQLITE_DONE;
    }

    /* Update the page-size to match the value read from the journal. 
    ** Use a testcase() macro to make sure that malloc failure within 
    ** PagerSetPagesize() is tested.
    */
    rc = sqlite3PagerSetPagesize(pPager, &iPageSize, -1);
    testcase( rc!=SQLITE_OK );

    /* Update the assumed sector-size to match the value used by 
    ** the process that created this journal. If this journal was
    ** created by a process other than this one, then this routine
    ** is being called from within pager_playback(). The local value
    ** of Pager.sectorSize is restored at the end of that routine.
    */
    pPager->sectorSize = iSectorSize;
  }

  pPager->journalOff += JOURNAL_HDR_SZ(pPager);
  return rc;
}